

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnexpectedCommand.h
# Opt level: O2

void __thiscall cmUnexpectedCommand::~cmUnexpectedCommand(cmUnexpectedCommand *this)

{
  ~cmUnexpectedCommand(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

cmUnexpectedCommand(std::string const& name, const char* error)
    : Name(name)
    , Error(error)
  {
  }